

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.c
# Opt level: O0

void INT_EVadd_standard_routines(CManager cm,char *extern_string,cod_extern_entry *externs)

{
  void *pvVar1;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  int count;
  event_path_data evp;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar2;
  void *ptr;
  
  ptr = *(void **)(in_RDI + 0x118);
  iVar2 = 0;
  if (*(long *)((long)ptr + 0xa0) == 0) {
    pvVar1 = INT_CMmalloc((size_t)ptr);
    *(void **)((long)ptr + 0xa0) = pvVar1;
  }
  else {
    while (*(long *)(*(long *)((long)ptr + 0xa0) + (long)iVar2 * 0x10) != 0) {
      iVar2 = iVar2 + 1;
    }
    pvVar1 = INT_CMrealloc(ptr,CONCAT44(iVar2,in_stack_ffffffffffffffd8));
    *(void **)((long)ptr + 0xa0) = pvVar1;
  }
  *(undefined8 *)(*(long *)((long)ptr + 0xa0) + (long)iVar2 * 0x10) = in_RSI;
  *(undefined8 *)(*(long *)((long)ptr + 0xa0) + (long)iVar2 * 0x10 + 8) = in_RDX;
  *(undefined8 *)(*(long *)((long)ptr + 0xa0) + (long)(iVar2 + 1) * 0x10) = 0;
  *(undefined8 *)(*(long *)((long)ptr + 0xa0) + (long)(iVar2 + 1) * 0x10 + 8) = 0;
  return;
}

Assistant:

extern void 
INT_EVadd_standard_routines(CManager cm, char *extern_string,
			    cod_extern_entry *externs)
{
    event_path_data evp = cm->evp;
    int count = 0;
    if (evp->externs == NULL) {
	evp->externs = malloc(sizeof(evp->externs[0]) * 2);
    } else {
	while(evp->externs[count].extern_decl != NULL) count++;
	evp->externs = realloc(evp->externs, 
			       sizeof(evp->externs[0]) * (count + 2));
    }
    evp->externs[count].extern_decl = extern_string;
    evp->externs[count].externs = externs;
    evp->externs[count + 1].extern_decl = NULL;
    evp->externs[count + 1].externs = NULL;
}